

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ArrayPtr<const_char> kj::_::safeUnixPath(sockaddr_un *addr,uint addrlen)

{
  size_t sVar1;
  ArrayPtr<const_char> AVar2;
  Fault f;
  Fault local_10;
  
  if (addr->sun_family != 1) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x7b9,FAILED,"addr->sun_family == AF_UNIX","\"not a unix address\"",
               (char (*) [19])"not a unix address");
    Debug::Fault::fatal(&local_10);
  }
  if (1 < addrlen) {
    sVar1 = (ulong)addrlen - 2;
    if ((sVar1 == 0) || (addr->sun_path[0] != '\0')) {
      sVar1 = strnlen(addr->sun_path,sVar1);
    }
    else {
      sVar1 = strnlen(addr->sun_path + 1,(ulong)addrlen - 3);
      sVar1 = sVar1 + 1;
    }
    AVar2.size_ = sVar1;
    AVar2.ptr = addr->sun_path;
    return AVar2;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x7ba,FAILED,"addrlen >= offsetof(sockaddr_un, sun_path)","\"invalid unix address\"",
             (char (*) [21])"invalid unix address");
  Debug::Fault::fatal(&local_10);
}

Assistant:

kj::ArrayPtr<const char> safeUnixPath(const struct sockaddr_un* addr, uint addrlen) {
  KJ_REQUIRE(addr->sun_family == AF_UNIX, "not a unix address");
  KJ_REQUIRE(addrlen >= offsetof(sockaddr_un, sun_path), "invalid unix address");

  size_t maxPathlen = addrlen - offsetof(sockaddr_un, sun_path);

  size_t pathlen;
  if (maxPathlen > 0 && addr->sun_path[0] == '\0') {
    // Linux "abstract" unix address
    pathlen = strnlen(addr->sun_path + 1, maxPathlen - 1) + 1;
  } else {
    pathlen = strnlen(addr->sun_path, maxPathlen);
  }
  return kj::arrayPtr(addr->sun_path, pathlen);
}